

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_79cbb::ParserImpl::ParsePrefixExpTail
          (ParserImpl *this,
          unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *exp,
          PrefixExpType *type)

{
  int iVar1;
  GCObject *pGVar2;
  long *plVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  SyntaxTree *pSVar7;
  SyntaxTree *pSVar8;
  TokenDetail op;
  TokenDetail *pTVar9;
  TokenDetail *pTVar10;
  ParseException *pPVar11;
  undefined4 *in_RCX;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar12;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp_1;
  TokenDetail member;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_48;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_40;
  String *local_38;
  
  pTVar9 = LookAhead((ParserImpl *)exp);
  if ((pTVar9->token_ == 0x5b) || (pTVar9 = LookAhead((ParserImpl *)exp), pTVar9->token_ == 0x2e)) {
    if (in_RCX != (undefined4 *)0x0) {
      *in_RCX = 1;
    }
    pGVar2 = *(GCObject **)type;
    type[0] = PrefixExpType_Normal;
    type[1] = PrefixExpType_Normal;
    NextToken((ParserImpl *)exp);
    pTVar9 = (TokenDetail *)(exp + 1);
    iVar1 = *(int *)&exp[4]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    if (iVar1 == 0x2e) {
      pTVar10 = NextToken((ParserImpl *)exp);
      if (pTVar10->token_ != 0x115) {
        pPVar11 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar11,"expect \'id\' after \'.\'",pTVar9);
        __cxa_throw(pPVar11,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      local_40.str_ = (String *)operator_new(0x38);
      ((local_40.str_)->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__MemberAccessor_00199528
      ;
      ((local_40.str_)->super_GCObject).next_ = pGVar2;
      uVar4 = *(undefined4 *)
               ((long)&exp[1]._M_t.
                       super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                       .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 4);
      uVar5 = *(undefined4 *)
               &exp[2]._M_t.
                super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
                .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
                super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      uVar6 = *(undefined4 *)
               ((long)&exp[2]._M_t.
                       super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                       .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 4);
      pSVar7 = exp[3]._M_t.
               super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
               super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
               super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      pSVar8 = exp[4]._M_t.
               super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
               super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
               super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      *(undefined4 *)&((local_40.str_)->super_GCObject).field_0x10 = *(undefined4 *)&pTVar9->field_0
      ;
      *(undefined4 *)&((local_40.str_)->super_GCObject).field_0x14 = uVar4;
      *(undefined4 *)&(local_40.str_)->field_1 = uVar5;
      *(undefined4 *)((long)&(local_40.str_)->field_1 + 4) = uVar6;
      *(SyntaxTree **)((long)&(local_40.str_)->field_1 + 8) = pSVar7;
      *(SyntaxTree **)&(local_40.str_)->length_ = pSVar8;
      *(undefined4 *)&(local_40.str_)->hash_ = 0;
    }
    else {
      if (iVar1 != 0x5b) {
        __assert_fail("current_.token_ == \'[\' || current_.token_ == \'.\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                      ,0x295,
                      "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseVar(std::unique_ptr<SyntaxTree>)"
                     );
      }
      pTVar10 = LookAhead((ParserImpl *)exp);
      iVar1 = pTVar10->line_;
      local_38 = (String *)0x0;
      member.field_0.number_ = 0.0;
      member.module_ = (String *)0x0;
      member.line_ = 0;
      member.column_ = 0;
      member.token_ = 0x11e;
      op.line_ = 0;
      op.column_ = 0;
      op.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
      op.module_ = (String *)0x0;
      op.token_ = 0x11e;
      op._28_4_ = member._28_4_;
      ParseExp((ParserImpl *)&exp_1,exp,op,(int)&local_38);
      if (local_38 != (String *)0x0) {
        (*(local_38->super_GCObject)._vptr_GCObject[1])();
      }
      pTVar10 = NextToken((ParserImpl *)exp);
      if (pTVar10->token_ != 0x5d) {
        pPVar11 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar11,"expect \']\'",pTVar9);
        __cxa_throw(pPVar11,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      local_40.str_ = (String *)operator_new(0x20);
      ((local_40.str_)->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__IndexAccessor_001994e8;
      ((local_40.str_)->super_GCObject).next_ = pGVar2;
      *(__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> *)
       &((local_40.str_)->super_GCObject).field_0x10 =
           exp_1._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      *(int *)&(local_40.str_)->field_1 = iVar1;
      *(undefined4 *)((long)&(local_40.str_)->field_1 + 4) = 0;
    }
    plVar3 = *(long **)type;
    *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)type = local_40;
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
      local_40 = *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)type;
    }
    type[0] = PrefixExpType_Normal;
    type[1] = PrefixExpType_Normal;
    ParsePrefixExpTail(this,exp,(PrefixExpType *)&local_40);
    aVar12 = local_40;
  }
  else {
    pTVar9 = LookAhead((ParserImpl *)exp);
    if ((((pTVar9->token_ != 0x3a) &&
         (pTVar9 = LookAhead((ParserImpl *)exp), pTVar9->token_ != 0x28)) &&
        (pTVar9 = LookAhead((ParserImpl *)exp), pTVar9->token_ != 0x7b)) &&
       (pTVar9 = LookAhead((ParserImpl *)exp), pTVar9->token_ != 0x116)) {
      this->lexer_ = *(Lexer **)type;
      type[0] = PrefixExpType_Normal;
      type[1] = PrefixExpType_Normal;
      return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
             (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
             this;
    }
    if (in_RCX != (undefined4 *)0x0) {
      *in_RCX = 2;
    }
    pGVar2 = *(GCObject **)type;
    type[0] = PrefixExpType_Normal;
    type[1] = PrefixExpType_Normal;
    pTVar9 = LookAhead((ParserImpl *)exp);
    if (pTVar9->token_ == 0x3a) {
      NextToken((ParserImpl *)exp);
      pTVar9 = NextToken((ParserImpl *)exp);
      if (pTVar9->token_ != 0x115) {
        pPVar11 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException
                  (pPVar11,"expect \'id\' after \':\'",(TokenDetail *)(exp + 1));
        __cxa_throw(pPVar11,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      member.field_0 = *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)(exp + 1);
      member.module_ =
           (String *)
           exp[2]._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      member._16_8_ =
           exp[3]._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      member._24_8_ =
           exp[4]._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      pTVar9 = LookAhead((ParserImpl *)exp);
      iVar1 = pTVar9->line_;
      ParseArgs((ParserImpl *)&exp_1);
      local_48.str_ = (String *)operator_new(0x40);
      ((local_48.str_)->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__MemberFuncCall_001995a8
      ;
      ((local_48.str_)->super_GCObject).next_ = pGVar2;
      *(undefined4 *)&((local_48.str_)->super_GCObject).field_0x10 = member.field_0._0_4_;
      *(undefined4 *)&((local_48.str_)->super_GCObject).field_0x14 = member.field_0._4_4_;
      *(undefined4 *)&(local_48.str_)->field_1 = member.module_._0_4_;
      *(undefined4 *)((long)&(local_48.str_)->field_1 + 4) = member.module_._4_4_;
      *(undefined8 *)((long)&(local_48.str_)->field_1 + 8) = member._16_8_;
      *(int *)((long)local_48 + 0x28) = member.token_;
      *(undefined4 *)((long)local_48 + 0x2c) = member._28_4_;
      (local_48.str_)->hash_ =
           (size_t)exp_1._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      *(int *)&local_48.str_[1].super_GCObject._vptr_GCObject = iVar1;
    }
    else {
      pTVar9 = LookAhead((ParserImpl *)exp);
      iVar1 = pTVar9->line_;
      ParseArgs((ParserImpl *)&member);
      local_48.str_ = (String *)operator_new(0x20);
      ((local_48.str_)->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__NormalFuncCall_00199568
      ;
      ((local_48.str_)->super_GCObject).next_ = pGVar2;
      *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&((local_48.str_)->super_GCObject).field_0x10 =
           member.field_0;
      *(int *)&(local_48.str_)->field_1 = iVar1;
    }
    plVar3 = *(long **)type;
    *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)type = local_48;
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
      local_48 = *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)type;
    }
    type[0] = PrefixExpType_Normal;
    type[1] = PrefixExpType_Normal;
    ParsePrefixExpTail(this,exp,(PrefixExpType *)&local_48);
    aVar12 = local_48;
  }
  if (aVar12.str_ != (String *)0x0) {
    (*((aVar12.str_)->super_GCObject)._vptr_GCObject[1])();
  }
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)this;
}

Assistant:

std::unique_ptr<SyntaxTree> ParsePrefixExpTail(std::unique_ptr<SyntaxTree> exp,
                                                       PrefixExpType *type)
        {
            if (LookAhead().token_ == '[' || LookAhead().token_ == '.')
            {
                if (type) *type = PrefixExpType_Var;
                exp = ParseVar(std::move(exp));
                return ParsePrefixExpTail(std::move(exp), type);
            }
            else if (LookAhead().token_ == ':' || LookAhead().token_ == '(' ||
                     LookAhead().token_ == '{' || LookAhead().token_ == Token_String)
            {
                if (type) *type = PrefixExpType_Functioncall;
                exp = ParseFunctionCall(std::move(exp));
                return ParsePrefixExpTail(std::move(exp), type);
            }
            else
            {
                return exp;
            }
        }